

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextInput.cpp
# Opt level: O3

void __thiscall cursespp::TextInput::~TextInput(TextInput *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable =
       (_func_int **)&PTR__TextInput_001a7b78;
  (this->super_Window).super_IWindow.super_IDisplayable._vptr_IDisplayable =
       (_func_int **)&PTR__TextInput_001a7d88;
  (this->super_Window).super_IWindow.super_IMouseHandler._vptr_IMouseHandler =
       (_func_int **)&PTR__TextInput_001a7db8;
  (this->super_Window).super_IWindow.super_IMessageTarget._vptr_IMessageTarget =
       (_func_int **)&PTR__TextInput_001a7de0;
  (this->super_IKeyHandler)._vptr_IKeyHandler = (_func_int **)&PTR__TextInput_001a7e08;
  (this->super_IInput)._vptr_IInput = (_func_int **)&PTR__TextInput_001a7e30;
  pcVar2 = (this->hintText)._M_dataplus._M_p;
  paVar1 = &(this->hintText).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->buffer)._M_dataplus._M_p;
  paVar1 = &(this->buffer).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->rawBlacklist);
  (this->TextChanged).
  super__signal_base2<cursespp::TextInput_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
  .super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__signal2_001a7f68;
  sigslot::
  _signal_base2<cursespp::TextInput_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
  ::~_signal_base2(&(this->TextChanged).
                    super__signal_base2<cursespp::TextInput_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
                  );
  (this->EnterPressed).super__signal_base1<cursespp::TextInput_*,_sigslot::multi_threaded_local>.
  super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__signal1_001a7eb8;
  sigslot::_signal_base1<cursespp::TextInput_*,_sigslot::multi_threaded_local>::~_signal_base1
            (&(this->EnterPressed).
              super__signal_base1<cursespp::TextInput_*,_sigslot::multi_threaded_local>);
  Window::~Window(&this->super_Window);
  return;
}

Assistant:

TextInput::~TextInput() {
}